

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::InstanceArray::boundSegment
          (BBox3fa *__return_storage_ptr__,InstanceArray *this,size_t i,size_t itime,BBox3fa *obbox0
          ,BBox3fa *obbox1,BBox3fa *bbox0,BBox3fa *bbox1,float tmin,float tmax)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  undefined8 uVar3;
  RTCFormat RVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  RawBufferView *pRVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  BBox3fa *delta;
  bool bVar14;
  float fVar15;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float in_XMM0_Dc;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  undefined4 uVar16;
  float fVar17;
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  float in_XMM5_Da;
  float in_XMM5_Db;
  float in_XMM5_Dc;
  float in_XMM5_Dd;
  float in_XMM6_Da;
  float fVar18;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float fVar19;
  float in_XMM6_Dd;
  float fVar20;
  float fVar21;
  float fVar24;
  undefined1 in_XMM7 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  uint uVar26;
  float fVar27;
  undefined1 in_XMM8 [16];
  float fVar28;
  float in_XMM10_Da;
  float fVar29;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float in_XMM11_Da;
  float fVar33;
  float fVar34;
  float fVar35;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float fVar36;
  float in_XMM11_Dd;
  float fVar37;
  undefined1 in_XMM12 [16];
  float in_XMM13_Da;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float in_XMM13_Db;
  float fVar42;
  float fVar43;
  float in_XMM13_Dc;
  float fVar44;
  float fVar45;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float fVar46;
  float fVar47;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  float in_XMM14_Dd;
  undefined8 local_558;
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  Vec3fa nom;
  undefined1 local_478 [8];
  undefined4 uStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [32];
  Vec3fa denom;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  Vec3fa pt;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  BBox3fa bt;
  
  if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
    pRVar7 = (this->l2w_buf).items;
    pRVar5 = pRVar7 + itime;
    RVar4 = pRVar7[itime].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        denom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x10);
        denom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar12);
        denom.field_0.m128[2] = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x20);
        denom.field_0.m128[3] = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        lVar12 = pRVar5->stride * i;
        uVar3 = *(undefined8 *)(pRVar5->ptr_ofs + lVar12 + 4);
        denom.field_0.m128[1] = (float)(int)uVar3;
        denom.field_0.m128[0] = (float)*(undefined4 *)(pRVar5->ptr_ofs + lVar12);
        denom.field_0.m128[2] = (float)(int)((ulong)uVar3 >> 0x20);
        denom.field_0.m128[3] = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      denom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x34);
      denom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar12);
      denom.field_0.m128[2] = *(float *)(pcVar6 + lVar12 + 0x38);
      fVar15 = *(float *)(pcVar6 + lVar12 + 0x28);
      fVar17 = *(float *)(pcVar6 + lVar12 + 0x30) * *(float *)(pcVar6 + lVar12 + 0x30) +
               *(float *)(pcVar6 + lVar12 + 0x2c) * *(float *)(pcVar6 + lVar12 + 0x2c) +
               *(float *)(pcVar6 + lVar12 + 0x24) * *(float *)(pcVar6 + lVar12 + 0x24) +
               fVar15 * fVar15;
      auVar30 = rsqrtss(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
      fVar39 = auVar30._0_4_;
      denom.field_0.m128[3] = fVar15 * (fVar39 * fVar39 * fVar17 * -0.5 * fVar39 + fVar39 * 1.5);
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      denom.field_0 =
           *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar5->ptr_ofs + pRVar5->stride * i);
    }
    RVar4 = pRVar7[itime + 1].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5[1].ptr_ofs;
        lVar12 = i * pRVar5[1].stride;
        local_468._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
        local_468._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
        local_468._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x28);
        local_468._12_4_ = 0;
        nom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x10);
        nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar12);
        nom.field_0.m128[2] = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x20);
        nom.field_0.m128[3] = 0.0;
        local_478._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x14);
        local_478._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 4);
        uStack_470 = *(undefined4 *)(pcVar6 + lVar12 + 0x24);
        fStack_46c = 0.0;
        local_458._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x1c);
        local_458._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
        local_458._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x2c);
        local_458._12_4_ = 0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5[1].ptr_ofs;
        lVar12 = i * pRVar5[1].stride;
        nom.field_0.m128[1] = (float)(int)*(undefined8 *)(pcVar6 + lVar12 + 4);
        nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar12);
        nom.field_0.m128[2] = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        nom.field_0.m128[3] = 0.0;
        local_478._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        local_478._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
        uStack_470 = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        fStack_46c = 0.0;
        local_468._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        local_468._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
        local_468._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        local_468._12_4_ = 0;
        local_458._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
        local_458._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x24);
        local_458._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
        local_458._12_4_ = 0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar12 = i * pRVar5[1].stride;
      local_478._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 4);
      local_468._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
      local_478._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
      local_468._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x14);
      local_468._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x10);
      nom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x34);
      nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar12);
      nom.field_0.m128[2] = *(float *)(pcVar6 + lVar12 + 0x38);
      uStack_470 = *(undefined4 *)(pcVar6 + lVar12 + 0x3c);
      local_458._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x1c);
      local_458._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
      local_458._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x20);
      fVar15 = *(float *)(pcVar6 + lVar12 + 0x24);
      fVar39 = *(float *)(pcVar6 + lVar12 + 0x28);
      fVar17 = *(float *)(pcVar6 + lVar12 + 0x2c);
      fVar20 = *(float *)(pcVar6 + lVar12 + 0x30);
      fVar33 = fVar20 * fVar20 + fVar17 * fVar17 + fVar15 * fVar15 + fVar39 * fVar39;
      auVar30 = rsqrtss(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
      fVar29 = auVar30._0_4_;
      fVar29 = fVar29 * fVar29 * fVar33 * -0.5 * fVar29 + fVar29 * 1.5;
      nom.field_0.m128[3] = fVar39 * fVar29;
      fStack_46c = fVar17 * fVar29;
      local_468._12_4_ = fVar29 * fVar20;
      local_458._12_4_ = fVar15 * fVar29;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar12 = i * pRVar5[1].stride;
      nom.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar6 + lVar12);
      _local_478 = *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                    ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar12 + 0x10))->m128;
      local_468 = *(undefined1 (*) [16])
                   ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar12 + 0x20))->m128;
      local_458._0_16_ =
           *(undefined1 (*) [16])
            ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar12 + 0x30))->m128;
    }
    MotionDerivativeCoefficients::MotionDerivativeCoefficients
              ((MotionDerivativeCoefficients *)&bt,(AffineSpace3ff *)&denom,(AffineSpace3ff *)&nom);
    pt.field_0._0_8_ = denom.field_0._0_8_;
    pt.field_0._8_8_ = denom.field_0._8_8_;
    local_318._0_8_ = nom.field_0._0_8_;
    local_318._8_8_ = nom.field_0._8_8_;
    local_308 = local_478;
    uStack_300 = _uStack_470;
    local_2f8 = local_468._0_8_;
    uStack_2f0 = local_468._8_8_;
    local_2e8 = local_458._0_8_;
    uStack_2e0 = local_458._8_8_;
    anon_unknown_117::boundSegmentNonlinear
              (__return_storage_ptr__,(MotionDerivativeCoefficients *)&bt,(AffineSpace3fa *)&pt,
               (AffineSpace3fa *)&local_318.field_1,obbox0,obbox1,bbox0,bbox1,tmin,tmax);
    return __return_storage_ptr__;
  }
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar5 = (this->l2w_buf).items;
    RVar4 = pRVar5->format;
    fVar39 = tmin;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        local_4e8._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x10);
        local_4e8._0_4_ = *(undefined4 *)(pcVar6 + lVar12);
        fStack_4e0 = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x20);
        fStack_4dc = 0.0;
        local_508._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x14);
        local_508._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 4);
        fStack_500 = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x24);
        fStack_4fc = 0.0;
        local_548._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
        local_548._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
        fStack_540 = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x28);
        fStack_53c = 0.0;
        in_XMM4_Db = *(float *)(pcVar6 + lVar12 + 0x1c);
        in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 0x2c);
        in_XMM0_Db = 0.0;
        in_XMM0_Dc = 0.0;
        in_XMM0_Dd = 0.0;
        in_XMM4_Dd = 0.0;
        local_518._4_4_ = in_XMM4_Db;
        local_518._0_4_ = *(float *)(pcVar6 + lVar12 + 0xc);
        fStack_510 = in_XMM4_Dc;
        fStack_50c = 0.0;
        fVar39 = in_XMM4_Dc;
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0xc);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        local_4e8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 4);
        local_4e8._0_4_ = *(undefined4 *)(pcVar6 + lVar12);
        fStack_4e0 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        fStack_4dc = 0.0;
        local_508._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        local_508._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
        fStack_500 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        fStack_4fc = 0.0;
        local_548._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        local_548._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
        fStack_540 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fStack_53c = 0.0;
        fVar39 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
        in_XMM0_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
        in_XMM0_Dc = 0.0;
        in_XMM0_Dd = 0.0;
        local_518._4_4_ = fVar39;
        local_518._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x24);
        fStack_510 = in_XMM0_Db;
        fStack_50c = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
      in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
      in_XMM10_Da = *(float *)(pcVar6 + lVar12);
      in_XMM11_Db = *(float *)(pcVar6 + lVar12 + 4);
      in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0xc);
      in_XMM13_Da = *(float *)(pcVar6 + lVar12 + 0x18);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
      fVar15 = *(float *)(pcVar6 + lVar12 + 0x24);
      fVar39 = *(float *)(pcVar6 + lVar12 + 0x28);
      fVar17 = *(float *)(pcVar6 + lVar12 + 0x2c);
      in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 0x30);
      in_XMM6_Db = 0.0;
      in_XMM6_Dc = 0.0;
      in_XMM6_Dd = 0.0;
      fVar29 = in_XMM6_Da * in_XMM6_Da + fVar17 * fVar17 + fVar15 * fVar15 + fVar39 * fVar39;
      auVar30 = rsqrtss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
      fVar20 = auVar30._0_4_;
      auVar23._4_12_ = auVar30._4_12_;
      fVar20 = fVar20 * fVar20 * fVar29 * -0.5 * fVar20 + fVar20 * 1.5;
      in_XMM13_Dd = fVar15 * fVar20;
      in_XMM5_Da = fVar39 * fVar20;
      in_XMM0_Db = fVar17 * fVar20;
      in_XMM4_Db = 0.0;
      in_XMM4_Dc = 0.0;
      in_XMM4_Dd = 0.0;
      auVar23._0_4_ = fVar20 * in_XMM6_Da;
      in_XMM7._0_8_ = auVar23._0_8_;
      in_XMM7._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
      in_XMM7._12_4_ = 0;
      in_XMM12._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
      in_XMM12._0_8_ = *(undefined8 *)(pcVar6 + lVar12 + 0x10);
      in_XMM12._12_4_ = auVar23._0_4_;
      in_XMM5_Db = 0.0;
      in_XMM5_Dd = 0.0;
      local_4e8._4_4_ = in_XMM10_Db;
      local_4e8._0_4_ = in_XMM10_Da;
      fStack_4e0 = in_XMM5_Dc;
      fStack_4dc = in_XMM5_Da;
      fVar39 = *(float *)(pcVar6 + lVar12 + 0x3c);
      in_XMM0_Dc = 0.0;
      in_XMM0_Dd = 0.0;
      local_508._4_4_ = in_XMM11_Db;
      local_508._0_4_ = in_XMM11_Da;
      fStack_500 = fVar39;
      fStack_4fc = in_XMM0_Db;
      local_518._4_4_ = in_XMM13_Db;
      local_518._0_4_ = in_XMM13_Da;
      fStack_510 = in_XMM13_Dc;
      fStack_50c = in_XMM13_Dd;
      in_XMM11_Dc = fVar39;
      in_XMM11_Dd = in_XMM0_Db;
      in_XMM4_Da = in_XMM0_Db;
      in_XMM10_Dc = in_XMM5_Dc;
      in_XMM10_Dd = in_XMM5_Da;
      _local_548 = in_XMM12;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      _local_4e8 = *(undefined1 (*) [16])(pcVar6 + lVar12);
      _local_508 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x10);
      _local_548 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x20);
      pauVar2 = (undefined1 (*) [16])(pcVar6 + lVar12 + 0x30);
      fVar39 = *(float *)*pauVar2;
      in_XMM0_Db = *(float *)(*pauVar2 + 4);
      in_XMM0_Dc = *(float *)(*pauVar2 + 8);
      in_XMM0_Dd = *(float *)(*pauVar2 + 0xc);
      _local_518 = *pauVar2;
    }
  }
  else {
    local_558 = itime;
    fVar15 = (this->super_Geometry).fnumTimeSegments;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar27 = 0.0;
    local_548._0_4_ = fVar15;
    fVar17 = (this->super_Geometry).time_range.lower;
    fVar29 = 0.0;
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar28 = (((float)itime - fVar17) / ((this->super_Geometry).time_range.upper - fVar17)) * fVar15
    ;
    fVar20 = fVar15;
    fVar39 = floorf(fVar28);
    if (fVar15 + -1.0 <= fVar39) {
      fVar39 = fVar15 + -1.0;
    }
    fVar37 = 0.0;
    fVar46 = 0.0;
    auVar30._0_4_ = 0.0;
    fVar15 = 0.0;
    if (0.0 <= fVar39) {
      fVar15 = fVar39;
    }
    uVar9 = (uint)fVar15;
    pRVar7 = (this->l2w_buf).items;
    pRVar5 = pRVar7 + uVar9;
    RVar4 = pRVar7[uVar9].format;
    in_XMM0_Db = extraout_XMM0_Db;
    in_XMM0_Dc = extraout_XMM0_Dc;
    in_XMM0_Dd = extraout_XMM0_Dd;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        in_XMM8._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x10);
        in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar12);
        fVar39 = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM8._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x20);
        in_XMM8._12_4_ = 0;
        fVar25 = *(float *)(pcVar6 + lVar12 + 0x24);
        local_508._4_4_ = *(float *)(pcVar6 + lVar12 + 0x14);
        local_508._0_4_ = *(float *)(pcVar6 + lVar12 + 4);
        fStack_500 = fVar25;
        fStack_4fc = 0.0;
        in_XMM4_Db = *(float *)(pcVar6 + lVar12 + 0x18);
        local_548._4_4_ = in_XMM4_Db;
        local_548._0_4_ = *(float *)(pcVar6 + lVar12 + 8);
        fStack_540 = *(float *)(pcVar6 + lVar12 + 0x28);
        fStack_53c = 0.0;
        in_XMM0_Db = *(float *)(pcVar6 + lVar12 + 0x1c);
        in_XMM0_Dc = *(float *)(pcVar6 + lVar12 + 0x2c);
        in_XMM0_Dd = 0.0;
        fVar20 = *(float *)(pcVar6 + lVar12 + 4);
        fVar24 = *(float *)(pcVar6 + lVar12 + 0x14);
        fVar17 = in_XMM0_Dc;
        fVar29 = 0.0;
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 0x28);
LAB_00a37012:
        in_XMM4_Dd = 0.0;
        fVar34 = 0.0;
        fVar33 = 0.0;
        fVar27 = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 4);
        in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar12);
        in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        in_XMM8._12_4_ = 0;
        local_508._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        local_508._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
        fStack_500 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        fStack_4fc = 0.0;
        local_548._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        local_548._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
        fStack_540 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fStack_53c = 0.0;
        in_XMM0_Db = *(float *)(pcVar6 + lVar12 + 0x28);
        in_XMM0_Dc = *(float *)((long)(pcVar6 + lVar12 + 0x28) + 4);
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x24);
        in_XMM0_Dd = 0.0;
        fVar17 = in_XMM0_Db;
        fVar29 = in_XMM0_Dc;
      }
    }
    else {
      if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
        in_XMM14_Da = *pfVar1;
        in_XMM14_Db = pfVar1[1];
        in_XMM13_Db = *(float *)(pcVar6 + lVar12 + 4);
        in_XMM14_Dc = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM13_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM0_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        in_XMM0_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fVar25 = 0.0;
        fVar17 = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar20 = *(float *)(pcVar6 + lVar12 + 0x28);
        fVar29 = *(float *)(pcVar6 + lVar12 + 0x2c);
        fVar33 = *(float *)(pcVar6 + lVar12 + 0x30);
        fVar34 = fVar33 * fVar33 + fVar29 * fVar29 + fVar17 * fVar17 + fVar20 * fVar20;
        auVar23 = rsqrtss(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
        in_XMM11_Db = 0.0;
        in_XMM11_Dc = 0.0;
        in_XMM11_Dd = 0.0;
        fVar24 = auVar23._0_4_;
        in_XMM11_Da = fVar24 * 1.5;
        in_XMM10_Da = fVar34 * -0.5 * fVar24;
        in_XMM10_Db = 0.0;
        in_XMM10_Dc = 0.0;
        in_XMM10_Dd = 0.0;
        fVar24 = fVar24 * fVar24 * in_XMM10_Da + in_XMM11_Da;
        in_XMM0_Dd = fVar17 * fVar24;
        in_XMM7._0_4_ = fVar20 * fVar24;
        in_XMM13_Dd = fVar29 * fVar24;
        in_XMM14_Dd = fVar24 * fVar33;
        fStack_540 = in_XMM14_Dc;
        local_548 = (undefined1  [8])*(undefined8 *)pfVar1;
        fStack_53c = in_XMM14_Dd;
        uVar16 = (undefined4)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
        in_XMM7._4_4_ = 0;
        in_XMM7._8_4_ = uVar16;
        in_XMM7._12_4_ = 0;
        in_XMM12._0_8_ =
             CONCAT44((int)*(undefined8 *)(pcVar6 + lVar12 + 0x34),*(undefined4 *)(pcVar6 + lVar12))
        ;
        in_XMM12._8_4_ = uVar16;
        in_XMM12._12_4_ = in_XMM7._0_4_;
        in_XMM8._8_4_ = uVar16;
        in_XMM8._0_8_ = in_XMM12._0_8_;
        in_XMM8._12_4_ = in_XMM7._0_4_;
        in_XMM13_Dc = *(float *)(pcVar6 + lVar12 + 0x3c);
        local_508._4_4_ = in_XMM13_Db;
        local_508._0_4_ = in_XMM13_Da;
        fStack_500 = in_XMM13_Dc;
        fStack_4fc = in_XMM13_Dd;
        in_XMM4_Db = 0.0;
        fVar20 = in_XMM0_Db;
        fVar24 = in_XMM0_Dc;
        fVar17 = in_XMM13_Dc;
        fVar29 = in_XMM13_Dd;
        in_XMM4_Da = in_XMM0_Dd;
        in_XMM4_Dc = in_XMM0_Dc;
        goto LAB_00a37012;
      }
      if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar12);
        _local_508 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x10);
        _local_548 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x20);
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x30);
        fVar39 = *pfVar1;
        in_XMM0_Db = pfVar1[1];
        in_XMM0_Dc = pfVar1[2];
        in_XMM0_Dd = pfVar1[3];
      }
    }
    in_XMM1_Dd = 0.0;
    in_XMM1_Dc = 0.0;
    in_XMM1_Db = 0.0;
    fVar28 = fVar28 - fVar15;
    pRVar5 = pRVar7 + (uVar9 + 1);
    RVar4 = pRVar7[uVar9 + 1].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        fVar29 = *(float *)(pcVar6 + lVar12 + 0x10);
        fVar17 = *(float *)(pcVar6 + lVar12);
        fVar20 = *(float *)(pcVar6 + lVar12 + 4);
        fVar15 = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        fVar33 = *(float *)(pcVar6 + lVar12 + 0x20);
        fVar34 = 0.0;
        fVar24 = *(float *)(pcVar6 + lVar12 + 0x14);
        fVar25 = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar27 = 0.0;
        fVar37 = *(float *)(pcVar6 + lVar12 + 0x18);
        fVar46 = *(float *)(pcVar6 + lVar12 + 0x28);
        auVar30._0_4_ = 0.0;
        in_XMM4_Db = *(float *)(pcVar6 + lVar12 + 0x1c);
        in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 0x2c);
        in_XMM4_Dd = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        fVar29 = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
        fVar33 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        fVar17 = *(float *)(pcVar6 + lVar12);
        fVar34 = 0.0;
        fVar24 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        fVar25 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        fVar20 = *(float *)(pcVar6 + lVar12 + 0xc);
        fVar27 = 0.0;
        fVar15 = *(float *)(pcVar6 + lVar12 + 0x18);
        fVar37 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        fVar46 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        auVar30._0_4_ = 0.0;
        in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
        in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0x24);
        in_XMM4_Dd = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      fVar15 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
      fVar37 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
      fVar29 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
      fVar33 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
      fVar17 = *(float *)(pcVar6 + lVar12);
      fVar24 = *(float *)(pcVar6 + lVar12 + 4);
      fVar46 = *(float *)(pcVar6 + lVar12 + 8);
      fVar20 = *(float *)(pcVar6 + lVar12 + 0xc);
      in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0x18);
      fVar25 = *(float *)(pcVar6 + lVar12 + 0x24);
      fVar34 = *(float *)(pcVar6 + lVar12 + 0x28);
      fVar27 = *(float *)(pcVar6 + lVar12 + 0x2c);
      in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0x30);
      in_XMM11_Db = 0.0;
      in_XMM11_Dc = 0.0;
      in_XMM11_Dd = 0.0;
      in_XMM13_Db = 0.0;
      in_XMM13_Dc = 0.0;
      in_XMM13_Dd = 0.0;
      fVar38 = in_XMM11_Da * in_XMM11_Da + fVar27 * fVar27 + fVar25 * fVar25 + fVar34 * fVar34;
      auVar30 = rsqrtss(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
      in_XMM14_Da = auVar30._0_4_ * 1.5;
      in_XMM14_Db = 0.0;
      in_XMM14_Dc = 0.0;
      in_XMM14_Dd = 0.0;
      in_XMM13_Da = fVar38 * -0.5 * auVar30._0_4_;
      auVar30._0_4_ = auVar30._0_4_ * auVar30._0_4_ * in_XMM13_Da + in_XMM14_Da;
      in_XMM7._0_4_ = fVar25 * auVar30._0_4_;
      fVar34 = fVar34 * auVar30._0_4_;
      fVar27 = fVar27 * auVar30._0_4_;
      auVar30._0_4_ = auVar30._0_4_ * in_XMM11_Da;
      in_XMM12._0_8_ = auVar30._0_8_;
      in_XMM12._8_4_ = fVar46;
      in_XMM12._12_4_ = 0;
      in_XMM10_Db = 0.0;
      in_XMM10_Dd = 0.0;
      fVar25 = *(float *)(pcVar6 + lVar12 + 0x3c);
      in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
      in_XMM7._4_4_ = 0;
      in_XMM7._8_4_ = in_XMM4_Dc;
      in_XMM7._12_4_ = 0;
      in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
      in_XMM4_Dd = in_XMM7._0_4_;
      in_XMM10_Da = fVar34;
      in_XMM10_Dc = fVar33;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      pfVar1 = (float *)(pcVar6 + lVar12);
      fVar17 = *pfVar1;
      fVar29 = pfVar1[1];
      fVar33 = pfVar1[2];
      fVar34 = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
      fVar20 = *pfVar1;
      fVar24 = pfVar1[1];
      fVar25 = pfVar1[2];
      fVar27 = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x20);
      fVar15 = *pfVar1;
      fVar37 = pfVar1[1];
      fVar46 = pfVar1[2];
      auVar30._0_4_ = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x30);
      in_XMM4_Da = *pfVar1;
      in_XMM4_Db = pfVar1[1];
      in_XMM4_Dc = pfVar1[2];
      in_XMM4_Dd = pfVar1[3];
    }
    fVar38 = 1.0 - fVar28;
    local_4e8._4_4_ = in_XMM8._4_4_ * fVar38 + fVar29 * fVar28;
    local_4e8._0_4_ = in_XMM8._0_4_ * fVar38 + fVar17 * fVar28;
    fStack_4e0 = in_XMM8._8_4_ * fVar38 + fVar33 * fVar28;
    fStack_4dc = in_XMM8._12_4_ * fVar38 + fVar34 * fVar28;
    local_508._4_4_ = (float)local_508._4_4_ * fVar38 + fVar24 * fVar28;
    local_508._0_4_ = (float)local_508._0_4_ * fVar38 + fVar20 * fVar28;
    fStack_500 = fStack_500 * fVar38 + fVar25 * fVar28;
    fStack_4fc = fStack_4fc * fVar38 + fVar27 * fVar28;
    local_548._4_4_ = (float)local_548._4_4_ * fVar38 + fVar37 * fVar28;
    local_548._0_4_ = (float)local_548._0_4_ * fVar38 + fVar15 * fVar28;
    fStack_540 = fStack_540 * fVar38 + fVar46 * fVar28;
    fStack_53c = fStack_53c * fVar38 + auVar30._0_4_ * fVar28;
    in_XMM6_Da = fVar28 * in_XMM4_Da;
    in_XMM6_Db = fVar28 * in_XMM4_Db;
    in_XMM6_Dc = fVar28 * in_XMM4_Dc;
    in_XMM6_Dd = fVar28 * in_XMM4_Dd;
    in_XMM5_Da = fVar38 * fVar39 + in_XMM6_Da;
    in_XMM5_Db = fVar38 * in_XMM0_Db + in_XMM6_Db;
    in_XMM5_Dc = fVar38 * in_XMM0_Dc + in_XMM6_Dc;
    in_XMM5_Dd = fVar38 * in_XMM0_Dd + in_XMM6_Dd;
    local_518._4_4_ = in_XMM5_Db;
    local_518._0_4_ = in_XMM5_Da;
    fStack_510 = in_XMM5_Dc;
    fStack_50c = in_XMM5_Dd;
  }
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar5 = (this->l2w_buf).items;
    RVar4 = pRVar5->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if ((int)RVar4 < 0x9244) {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar12 = i * pRVar5->stride;
          in_XMM13_Db = *(float *)(pcVar6 + lVar12 + 0x10);
          in_XMM13_Da = *(float *)(pcVar6 + lVar12);
          in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 4);
          in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 8);
          in_XMM5_Da = *(float *)(pcVar6 + lVar12 + 0xc);
          in_XMM13_Dc = *(float *)(pcVar6 + lVar12 + 0x20);
          in_XMM13_Dd = 0.0;
          in_XMM4_Db = *(float *)(pcVar6 + lVar12 + 0x14);
          in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 0x24);
          in_XMM4_Dd = 0.0;
          in_XMM6_Db = *(float *)(pcVar6 + lVar12 + 0x18);
          in_XMM6_Dc = *(float *)(pcVar6 + lVar12 + 0x28);
          in_XMM6_Dd = 0.0;
          in_XMM5_Db = *(float *)(pcVar6 + lVar12 + 0x1c);
          in_XMM5_Dc = *(float *)(pcVar6 + lVar12 + 0x2c);
          in_XMM5_Dd = 0.0;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar12 = i * pRVar5->stride;
          in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
          in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
          in_XMM13_Da = *(float *)(pcVar6 + lVar12);
          in_XMM13_Dd = 0.0;
          in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
          in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
          in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0xc);
          in_XMM4_Dd = 0.0;
          in_XMM6_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
          in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
          in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 0x18);
          in_XMM6_Dd = 0.0;
          in_XMM5_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
          in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
          in_XMM5_Da = *(float *)(pcVar6 + lVar12 + 0x24);
          in_XMM5_Dd = 0.0;
        }
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 0x10);
        in_XMM6_Db = *(float *)((long)(pcVar6 + lVar12 + 0x10) + 4);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
        in_XMM13_Da = *(float *)(pcVar6 + lVar12);
        in_XMM4_Db = *(float *)(pcVar6 + lVar12 + 4);
        in_XMM6_Dc = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM5_Da = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM5_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fVar15 = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x28);
        fVar17 = *(float *)(pcVar6 + lVar12 + 0x2c);
        fVar20 = *(float *)(pcVar6 + lVar12 + 0x30);
        fVar33 = fVar20 * fVar20 + fVar17 * fVar17 + fVar15 * fVar15 + fVar39 * fVar39;
        auVar30 = rsqrtss(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
        fVar29 = auVar30._0_4_;
        fVar29 = fVar29 * fVar29 * fVar33 * -0.5 * fVar29 + fVar29 * 1.5;
        in_XMM5_Dd = fVar15 * fVar29;
        in_XMM13_Dd = fVar39 * fVar29;
        in_XMM4_Dd = fVar17 * fVar29;
        in_XMM6_Dd = fVar29 * fVar20;
        in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 0x3c);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        pfVar1 = (float *)(pcVar6 + lVar12);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x20);
        in_XMM6_Da = *pfVar1;
        in_XMM6_Db = pfVar1[1];
        in_XMM6_Dc = pfVar1[2];
        in_XMM6_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x30);
        in_XMM5_Da = *pfVar1;
        in_XMM5_Db = pfVar1[1];
        in_XMM5_Dc = pfVar1[2];
        in_XMM5_Dd = pfVar1[3];
      }
      fVar34 = in_XMM13_Dd * in_XMM4_Dd + in_XMM5_Dd * in_XMM6_Dd;
      fVar25 = in_XMM13_Dd * in_XMM4_Dd - in_XMM5_Dd * in_XMM6_Dd;
      fVar20 = in_XMM5_Dd * in_XMM5_Dd + in_XMM13_Dd * in_XMM13_Dd + -in_XMM4_Dd * in_XMM4_Dd +
               -in_XMM6_Dd * in_XMM6_Dd;
      fVar39 = in_XMM5_Dd * in_XMM5_Dd - in_XMM13_Dd * in_XMM13_Dd;
      fVar37 = in_XMM4_Dd * in_XMM4_Dd + fVar39 + -in_XMM6_Dd * in_XMM6_Dd;
      fVar17 = in_XMM13_Dd * in_XMM6_Dd - in_XMM5_Dd * in_XMM4_Dd;
      fVar28 = in_XMM5_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM6_Dd;
      fVar46 = in_XMM4_Dd * in_XMM6_Dd + in_XMM13_Dd * in_XMM5_Dd;
      fVar15 = in_XMM4_Dd * in_XMM6_Dd - in_XMM13_Dd * in_XMM5_Dd;
      fVar34 = fVar34 + fVar34;
      fVar17 = fVar17 + fVar17;
      fVar39 = in_XMM6_Dd * in_XMM6_Dd + fVar39 + -in_XMM4_Dd * in_XMM4_Dd;
      fVar29 = fVar20 * 1.0 + fVar34 * 0.0 + fVar17 * 0.0;
      fVar33 = fVar20 * 0.0 + fVar34 * 1.0 + fVar17 * 0.0;
      fVar24 = fVar20 * 0.0 + fVar34 * 0.0 + fVar17 * 1.0;
      fVar17 = fVar20 * 0.0 + fVar34 * 0.0 + fVar17 * 0.0;
      fVar46 = fVar46 + fVar46;
      fVar25 = fVar25 + fVar25;
      fVar20 = fVar25 * 1.0 + fVar37 * 0.0 + fVar46 * 0.0;
      fVar34 = fVar25 * 0.0 + fVar37 * 1.0 + fVar46 * 0.0;
      fVar27 = fVar25 * 0.0 + fVar37 * 0.0 + fVar46 * 1.0;
      fVar25 = fVar25 * 0.0 + fVar37 * 0.0 + fVar46 * 0.0;
      fVar28 = fVar28 + fVar28;
      fVar15 = fVar15 + fVar15;
      fVar37 = fVar28 * 1.0 + fVar15 * 0.0 + fVar39 * 0.0;
      fVar46 = fVar28 * 0.0 + fVar15 * 1.0 + fVar39 * 0.0;
      auVar30._0_4_ = fVar28 * 0.0 + fVar15 * 0.0 + fVar39 * 1.0;
      fVar15 = fVar28 * 0.0 + fVar15 * 0.0 + fVar39 * 0.0;
      in_XMM14_Da = in_XMM13_Da * fVar29 + fVar20 * 0.0 + fVar37 * 0.0;
      in_XMM14_Db = in_XMM13_Da * fVar33 + fVar34 * 0.0 + fVar46 * 0.0;
      in_XMM14_Dc = in_XMM13_Da * fVar24 + fVar27 * 0.0 + auVar30._0_4_ * 0.0;
      in_XMM14_Dd = in_XMM13_Da * fVar17 + fVar25 * 0.0 + fVar15 * 0.0;
      in_XMM11_Da = in_XMM4_Da * fVar29 + in_XMM4_Db * fVar20 + fVar37 * 0.0;
      in_XMM11_Db = in_XMM4_Da * fVar33 + in_XMM4_Db * fVar34 + fVar46 * 0.0;
      in_XMM11_Dc = in_XMM4_Da * fVar24 + in_XMM4_Db * fVar27 + auVar30._0_4_ * 0.0;
      in_XMM11_Dd = in_XMM4_Da * fVar17 + in_XMM4_Db * fVar25 + fVar15 * 0.0;
      fVar39 = in_XMM6_Da * fVar29 + in_XMM6_Db * fVar20 + in_XMM6_Dc * fVar37;
      in_XMM0_Db = in_XMM6_Da * fVar33 + in_XMM6_Db * fVar34 + in_XMM6_Dc * fVar46;
      in_XMM0_Dc = in_XMM6_Da * fVar24 + in_XMM6_Db * fVar27 + in_XMM6_Dc * auVar30._0_4_;
      in_XMM0_Dd = in_XMM6_Da * fVar17 + in_XMM6_Db * fVar25 + in_XMM6_Dc * fVar15;
      local_558._4_4_ =
           in_XMM5_Da * fVar33 + in_XMM5_Db * fVar34 + in_XMM5_Dc * fVar46 + in_XMM13_Dc + 0.0;
      local_558._0_4_ =
           in_XMM5_Da * fVar29 + in_XMM5_Db * fVar20 + in_XMM5_Dc * fVar37 + in_XMM13_Db + 0.0;
      fStack_550 = in_XMM5_Da * fVar24 + in_XMM5_Db * fVar27 + in_XMM5_Dc * auVar30._0_4_ +
                   in_XMM4_Dc + 0.0;
      fStack_54c = in_XMM5_Da * fVar17 + in_XMM5_Db * fVar25 + in_XMM5_Dc * fVar15 + 0.0;
      goto LAB_00a37ae8;
    }
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        in_XMM14_Db = *(float *)(pcVar6 + lVar12 + 0x10);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12);
        in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 4);
        fVar39 = *(float *)(pcVar6 + lVar12 + 8);
        local_558._0_4_ = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM14_Dc = *(float *)(pcVar6 + lVar12 + 0x20);
        in_XMM14_Dd = 0.0;
        in_XMM11_Db = *(float *)(pcVar6 + lVar12 + 0x14);
        in_XMM11_Dc = *(float *)(pcVar6 + lVar12 + 0x24);
        in_XMM11_Dd = 0.0;
        in_XMM0_Db = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM0_Dc = *(float *)(pcVar6 + lVar12 + 0x28);
        in_XMM0_Dd = 0.0;
        local_558._4_4_ = *(float *)(pcVar6 + lVar12 + 0x1c);
        fStack_550 = *(float *)(pcVar6 + lVar12 + 0x2c);
        fStack_54c = 0.0;
      }
      else {
        if (RVar4 != RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) goto LAB_00a37ae8;
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12);
        in_XMM14_Dd = 0.0;
        in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM11_Dd = 0.0;
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM0_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        in_XMM0_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        in_XMM0_Dd = 0.0;
        local_558._4_4_ = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
        fStack_550 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
        local_558._0_4_ = *(float *)(pcVar6 + lVar12 + 0x24);
        fStack_54c = 0.0;
      }
    }
    else {
      if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        fVar39 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        in_XMM0_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12);
        in_XMM11_Db = *(float *)(pcVar6 + lVar12 + 4);
        in_XMM0_Dc = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        local_558._0_4_ = *(float *)(pcVar6 + lVar12 + 0x18);
        fStack_54c = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar15 = *(float *)(pcVar6 + lVar12 + 0x28);
        fVar17 = *(float *)(pcVar6 + lVar12 + 0x2c);
        fVar20 = *(float *)(pcVar6 + lVar12 + 0x30);
        fVar33 = fVar20 * fVar20 + fVar17 * fVar17 + fStack_54c * fStack_54c + fVar15 * fVar15;
        auVar30 = rsqrtss(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
        fVar29 = auVar30._0_4_;
        fVar29 = fVar29 * fVar29 * fVar33 * -0.5 * fVar29 + fVar29 * 1.5;
        fStack_54c = fStack_54c * fVar29;
        in_XMM14_Dd = fVar15 * fVar29;
        in_XMM11_Dd = fVar17 * fVar29;
        in_XMM0_Dd = fVar29 * fVar20;
        in_XMM11_Dc = *(float *)(pcVar6 + lVar12 + 0x3c);
        fStack_550 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        local_558._4_4_ = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        goto LAB_00a37728;
      }
      if (RVar4 != RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) goto LAB_00a37ae8;
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = i * pRVar5->stride;
      pfVar1 = (float *)(pcVar6 + lVar12);
      in_XMM14_Da = *pfVar1;
      in_XMM14_Db = pfVar1[1];
      in_XMM14_Dc = pfVar1[2];
      in_XMM14_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
      in_XMM11_Da = *pfVar1;
      in_XMM11_Db = pfVar1[1];
      in_XMM11_Dc = pfVar1[2];
      in_XMM11_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x20);
      fVar39 = *pfVar1;
      in_XMM0_Db = pfVar1[1];
      in_XMM0_Dc = pfVar1[2];
      in_XMM0_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x30);
      local_558._0_4_ = *pfVar1;
      local_558._4_4_ = pfVar1[1];
      fStack_550 = pfVar1[2];
      fStack_54c = pfVar1[3];
    }
  }
  else {
    fVar15 = (this->super_Geometry).fnumTimeSegments;
    fVar20 = 0.0;
    fVar29 = 0.0;
    fVar33 = 0.0;
    fVar25 = (this->super_Geometry).time_range.lower;
    fVar34 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    fVar37 = (((float)(itime + 1) - fVar25) / ((this->super_Geometry).time_range.upper - fVar25)) *
             fVar15;
    fVar17 = fVar15;
    fVar24 = tmax;
    fVar39 = floorf(fVar37);
    if (fVar15 + -1.0 <= fVar39) {
      fVar39 = fVar15 + -1.0;
    }
    fVar15 = 0.0;
    if (0.0 <= fVar39) {
      fVar15 = fVar39;
    }
    uVar9 = (uint)fVar15;
    fVar37 = fVar37 - fVar15;
    pRVar7 = (this->l2w_buf).items;
    pRVar5 = pRVar7 + uVar9;
    RVar4 = pRVar7[uVar9].format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar15 = in_XMM14_Dc;
      if ((int)RVar4 < 0x9244) {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar12 = pRVar5->stride * i;
          in_XMM10_Db = *(float *)(pcVar6 + lVar12 + 0x10);
          in_XMM10_Da = *(float *)(pcVar6 + lVar12);
          in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 8);
          fVar25 = *(float *)(pcVar6 + lVar12 + 0xc);
          in_XMM10_Dc = *(float *)(pcVar6 + lVar12 + 0x20);
          in_XMM10_Dd = 0.0;
          local_4b8._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x14);
          local_4b8._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 4);
          fStack_4b0 = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x24);
          fStack_4ac = 0.0;
          in_XMM11_Db = *(float *)(pcVar6 + lVar12 + 0x18);
          in_XMM11_Dc = *(float *)(pcVar6 + lVar12 + 0x28);
          in_XMM11_Dd = 0.0;
          fVar34 = *(float *)(pcVar6 + lVar12 + 0x1c);
          fVar27 = *(float *)(pcVar6 + lVar12 + 0x2c);
          fVar28 = 0.0;
          local_4c8._4_4_ = fVar34;
          local_4c8._0_4_ = fVar25;
          fStack_4c0 = fVar27;
          fStack_4bc = 0.0;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar12 = pRVar5->stride * i;
          in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
          in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
          in_XMM10_Da = *(float *)(pcVar6 + lVar12);
          in_XMM10_Dd = 0.0;
          local_4b8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
          local_4b8._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
          fStack_4b0 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
          fStack_4ac = 0.0;
          in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
          in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
          in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0x18);
          in_XMM11_Dd = 0.0;
          local_4c8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
          local_4c8._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x24);
          fStack_4c0 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
          fStack_4bc = 0.0;
        }
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        in_XMM11_Da = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        in_XMM11_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        in_XMM10_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
        in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
        in_XMM10_Da = *(float *)(pcVar6 + lVar12);
        in_XMM11_Dc = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM12._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 4);
        in_XMM12._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        fVar27 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fVar25 = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar15 = *(float *)(pcVar6 + lVar12 + 0x28);
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x2c);
        fVar17 = *(float *)(pcVar6 + lVar12 + 0x30);
        fVar29 = fVar17 * fVar17 + fVar39 * fVar39 + fVar25 * fVar25 + fVar15 * fVar15;
        auVar30 = rsqrtss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
        fVar20 = auVar30._0_4_;
        fVar20 = fVar20 * fVar20 * fVar29 * -0.5 * fVar20 + fVar20 * 1.5;
        fVar25 = fVar25 * fVar20;
        in_XMM10_Dd = fVar15 * fVar20;
        in_XMM11_Dd = fVar20 * fVar17;
        in_XMM12._12_4_ = fVar39 * fVar20;
        in_XMM12._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x3c);
        fVar34 = 0.0;
        fVar28 = 0.0;
        local_4c8._4_4_ = in_XMM14_Db;
        local_4c8._0_4_ = in_XMM14_Da;
        fStack_4c0 = fVar27;
        fStack_4bc = fVar25;
        fVar15 = fVar27;
        in_XMM14_Dd = fVar25;
        _local_4b8 = in_XMM12;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        pfVar1 = (float *)(pcVar6 + lVar12);
        in_XMM10_Da = *pfVar1;
        in_XMM10_Db = pfVar1[1];
        in_XMM10_Dc = pfVar1[2];
        in_XMM10_Dd = pfVar1[3];
        _local_4b8 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x10);
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x20);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        _local_4c8 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x30);
      }
      pRVar5 = pRVar7 + (uVar9 + 1);
      RVar4 = pRVar7[uVar9 + 1].format;
      if ((int)RVar4 < 0x9244) {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar12 = i * pRVar5->stride;
          in_XMM14_Db = *(float *)(pcVar6 + lVar12 + 0x10);
          in_XMM14_Da = *(float *)(pcVar6 + lVar12);
          fVar24 = *(float *)(pcVar6 + lVar12 + 4);
          fVar25 = *(float *)(pcVar6 + lVar12 + 0xc);
          fVar15 = *(float *)(pcVar6 + lVar12 + 0x20);
          in_XMM14_Dd = 0.0;
          in_XMM1_Db = *(float *)(pcVar6 + lVar12 + 0x14);
          in_XMM1_Dc = *(float *)(pcVar6 + lVar12 + 0x24);
          in_XMM1_Dd = 0.0;
          in_XMM12._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
          in_XMM12._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
          in_XMM12._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x28);
          in_XMM12._12_4_ = 0;
          fVar34 = *(float *)(pcVar6 + lVar12 + 0x1c);
          fVar27 = *(float *)(pcVar6 + lVar12 + 0x2c);
          fVar28 = 0.0;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar6 = pRVar5->ptr_ofs;
          lVar12 = i * pRVar5->stride;
          in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
          fVar15 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
          in_XMM14_Da = *(float *)(pcVar6 + lVar12);
          in_XMM14_Dd = 0.0;
          in_XMM1_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
          in_XMM1_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
          fVar24 = *(float *)(pcVar6 + lVar12 + 0xc);
          in_XMM1_Dd = 0.0;
          in_XMM12._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
          in_XMM12._0_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x18);
          in_XMM12._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
          in_XMM12._12_4_ = 0;
          fVar34 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
          fVar27 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
          fVar25 = *(float *)(pcVar6 + lVar12 + 0x24);
          fVar28 = 0.0;
        }
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
        fVar15 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12);
        in_XMM1_Db = *(float *)(pcVar6 + lVar12 + 4);
        fVar24 = *(float *)(pcVar6 + lVar12 + 0xc);
        fVar25 = *(float *)(pcVar6 + lVar12 + 0x18);
        fVar34 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        fVar27 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fVar28 = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x28);
        in_XMM1_Dd = *(float *)(pcVar6 + lVar12 + 0x2c);
        fVar17 = *(float *)(pcVar6 + lVar12 + 0x30);
        fVar29 = fVar17 * fVar17 + in_XMM1_Dd * in_XMM1_Dd + fVar28 * fVar28 + fVar39 * fVar39;
        auVar30 = rsqrtss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
        fVar20 = auVar30._0_4_;
        fVar20 = fVar20 * fVar20 * fVar29 * -0.5 * fVar20 + fVar20 * 1.5;
        fVar28 = fVar28 * fVar20;
        in_XMM14_Dd = fVar39 * fVar20;
        in_XMM1_Dd = in_XMM1_Dd * fVar20;
        in_XMM12._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 8);
        in_XMM12._0_8_ = *(undefined8 *)(pcVar6 + lVar12 + 0x10);
        in_XMM12._12_4_ = fVar20 * fVar17;
        in_XMM1_Dc = *(float *)(pcVar6 + lVar12 + 0x3c);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        pfVar1 = (float *)(pcVar6 + lVar12);
        in_XMM14_Da = *pfVar1;
        in_XMM14_Db = pfVar1[1];
        fVar15 = pfVar1[2];
        in_XMM14_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
        fVar24 = *pfVar1;
        in_XMM1_Db = pfVar1[1];
        in_XMM1_Dc = pfVar1[2];
        in_XMM1_Dd = pfVar1[3];
        in_XMM12 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x20);
        pfVar1 = (float *)(pcVar6 + lVar12 + 0x30);
        fVar25 = *pfVar1;
        fVar34 = pfVar1[1];
        fVar27 = pfVar1[2];
        fVar28 = pfVar1[3];
      }
      fVar39 = in_XMM12._12_4_;
      fVar20 = in_XMM11_Dd * fVar39 +
               in_XMM1_Dd * fStack_4ac + fVar28 * fStack_4bc + in_XMM10_Dd * in_XMM14_Dd;
      fVar17 = -fVar20;
      if (fVar20 < fVar17) {
        fVar39 = -fVar39;
      }
      fVar33 = ABS(fVar20);
      fVar29 = fVar17;
      if (fVar17 <= fVar20) {
        fVar29 = fVar20;
      }
      fVar46 = 1.0 - fVar33;
      if (fVar46 < 0.0) {
        fVar46 = sqrtf(fVar46);
      }
      else {
        fVar46 = SQRT(fVar46);
      }
      auVar30._0_4_ =
           1.5707964 -
           fVar46 * (((((fVar33 * -0.0043095737 + 0.0192803) * fVar33 + -0.04489909) * fVar33 +
                      0.08785567) * fVar33 + -0.21450998) * fVar33 + 1.5707952);
      fVar46 = 0.0;
      if (0.0 <= auVar30._0_4_) {
        fVar46 = auVar30._0_4_;
      }
      fVar33 = (float)(-(uint)(1.0 < fVar33) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar33) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar46 & -(uint)(fVar29 < 0.0) |
                                   ~-(uint)(fVar29 < 0.0) & (uint)fVar46))) * fVar37;
      auVar30._0_4_ = floorf(fVar33 * 0.63661975);
      fVar33 = fVar33 - auVar30._0_4_ * 1.5707964;
      fVar46 = fVar33 * fVar33;
      uVar9 = (int)auVar30._0_4_ & 3;
      fVar38 = ((((fVar46 * -2.5963018e-07 + 2.4756235e-05) * fVar46 + -0.001388833) * fVar46 +
                0.04166664) * fVar46 + -0.5) * fVar46 + 1.0;
      fVar33 = (((((fVar46 * -2.5029328e-08 + 2.7600126e-06) * fVar46 + -0.00019842605) * fVar46 +
                 0.008333348) * fVar46 + -0.16666667) * fVar46 + 1.0) * fVar33;
      fVar46 = fVar38;
      if (((int)auVar30._0_4_ & 1U) != 0) {
        fVar46 = fVar33;
        fVar33 = fVar38;
      }
      fVar17 = (float)(~-(uint)(fVar20 < fVar17) & (uint)in_XMM14_Dd |
                      (uint)-in_XMM14_Dd & -(uint)(fVar20 < fVar17));
      if (1 < uVar9) {
        fVar33 = -fVar33;
      }
      if (uVar9 - 1 < 2) {
        fVar46 = -fVar46;
      }
      fVar38 = fVar29 * in_XMM10_Dd - fVar17;
      fVar36 = fVar29 * in_XMM11_Dd - fVar39;
      auVar30._0_4_ = 1.0 - fVar37;
      fVar17 = auVar30._0_4_ * in_XMM10_Dd + fVar17 * fVar37;
      fVar39 = auVar30._0_4_ * in_XMM11_Dd + fVar39 * fVar37;
      uVar9 = (int)((uint)(fVar20 < 0.0) << 0x1f) >> 0x1f;
      uVar26 = (int)((uint)(fVar20 < 0.0) << 0x1f) >> 0x1f;
      fVar43 = (float)((uint)-fVar28 & uVar9 | ~uVar9 & (uint)fVar28);
      fVar44 = (float)((uint)-in_XMM1_Dd & uVar26 | ~uVar26 & (uint)in_XMM1_Dd);
      fVar20 = fVar29 * (float)local_4c8._4_4_ - fVar43;
      fVar28 = fVar29 * fStack_4ac - fVar44;
      auVar31._0_8_ = CONCAT44(in_XMM11_Dd,fVar36) ^ 0x8000000000000000;
      auVar31._8_4_ = -in_XMM11_Dd;
      auVar31._12_4_ = -in_XMM11_Dd;
      auVar32._4_12_ = auVar31._4_12_;
      auVar32._0_4_ = fVar36 * fVar36 + fVar28 * fVar28 + fVar20 * fVar20 + fVar38 * fVar38;
      auVar22._0_8_ = CONCAT44(in_XMM11_Dd,auVar32._0_4_) ^ 0x8000000000000000;
      auVar22._8_4_ = -in_XMM11_Dd;
      auVar22._12_4_ = -in_XMM11_Dd;
      auVar23 = rsqrtss(auVar22,auVar32);
      fVar42 = auVar23._0_4_;
      fVar42 = fVar42 * fVar42 * auVar32._0_4_ * -0.5 * fVar42 + fVar42 * 1.5;
      fVar43 = (float)local_4c8._4_4_ * auVar30._0_4_ + fVar43 * fVar37;
      fVar44 = fStack_4ac * auVar30._0_4_ + fVar44 * fVar37;
      fVar40 = fVar39 * fVar39 + fVar44 * fVar44 + fVar43 * fVar43 + fVar17 * fVar17;
      auVar23 = rsqrtss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar45 = auVar23._0_4_;
      fVar45 = fVar45 * fVar45 * fVar40 * -0.5 * fVar45 + fVar45 * 1.5;
      local_3c8 = in_XMM12._0_4_;
      fStack_3c4 = in_XMM12._4_4_;
      fStack_3c0 = in_XMM12._8_4_;
      if (0.9995 < fVar29) {
        fVar17 = fVar17 * fVar45;
      }
      else {
        fVar17 = in_XMM10_Dd * fVar46 - fVar38 * fVar42 * fVar33;
      }
      uVar9 = (int)((uint)(0.9995 < fVar29) << 0x1f) >> 0x1f;
      uVar26 = (int)((uint)(0.9995 < fVar29) << 0x1f) >> 0x1f;
      fVar20 = (float)(~uVar9 & (uint)(fVar46 * (float)local_4c8._4_4_ - fVar33 * fVar42 * fVar20) |
                      (uint)(fVar45 * fVar43) & uVar9);
      fVar28 = (float)(~uVar26 & (uint)(fVar46 * fStack_4ac - fVar33 * fVar42 * fVar28) |
                      (uint)(fVar45 * fVar44) & uVar26);
      if (0.9995 < fVar29) {
        fVar39 = fVar39 * fVar45;
      }
      else {
        fVar39 = fVar46 * in_XMM11_Dd - fVar36 * fVar42 * fVar33;
      }
      fVar33 = in_XMM14_Db * fVar37;
      fVar47 = in_XMM10_Da * auVar30._0_4_ + in_XMM14_Da * fVar37;
      fVar29 = (float)local_4b8._0_4_ * auVar30._0_4_ + fVar24 * fVar37;
      fVar24 = (float)local_4b8._4_4_ * auVar30._0_4_ + in_XMM1_Db * fVar37;
      fVar38 = in_XMM11_Da * auVar30._0_4_ + local_3c8 * fVar37;
      fVar43 = in_XMM11_Db * auVar30._0_4_ + fStack_3c4 * fVar37;
      fVar44 = in_XMM11_Dc * auVar30._0_4_ + fStack_3c0 * fVar37;
      fVar46 = (float)local_4c8._0_4_ * auVar30._0_4_ + fVar25 * fVar37;
      fVar34 = (float)local_4c8._4_4_ * auVar30._0_4_ + fVar34 * fVar37;
      fVar27 = fStack_4c0 * auVar30._0_4_ + fVar27 * fVar37;
      fVar40 = fVar17 * fVar28 + fVar20 * fVar39;
      fVar45 = fVar17 * fVar28 - fVar20 * fVar39;
      fVar42 = fVar20 * fVar20 + fVar17 * fVar17 + -fVar28 * fVar28 + -fVar39 * fVar39;
      fVar36 = fVar20 * fVar20 - fVar17 * fVar17;
      fVar35 = fVar28 * fVar28 + fVar36 + -fVar39 * fVar39;
      fVar41 = fVar17 * fVar39 - fVar20 * fVar28;
      fVar18 = fVar20 * fVar28 + fVar17 * fVar39;
      fVar25 = fVar28 * fVar39 + fVar20 * fVar17;
      fVar21 = fVar28 * fVar39 - fVar20 * fVar17;
      fVar40 = fVar40 + fVar40;
      fVar41 = fVar41 + fVar41;
      fVar39 = fVar39 * fVar39 + fVar36 + -fVar28 * fVar28;
      fVar17 = fVar42 * 1.0 + fVar40 * 0.0 + fVar41 * 0.0;
      fVar20 = fVar42 * 0.0 + fVar40 * 1.0 + fVar41 * 0.0;
      fVar28 = fVar42 * 0.0 + fVar40 * 0.0 + fVar41 * 1.0;
      fVar42 = fVar42 * 0.0 + fVar40 * 0.0 + fVar41 * 0.0;
      fVar25 = fVar25 + fVar25;
      fVar45 = fVar45 + fVar45;
      fVar36 = fVar45 * 1.0 + fVar35 * 0.0 + fVar25 * 0.0;
      fVar40 = fVar45 * 0.0 + fVar35 * 1.0 + fVar25 * 0.0;
      fVar41 = fVar45 * 0.0 + fVar35 * 0.0 + fVar25 * 1.0;
      fVar25 = fVar45 * 0.0 + fVar35 * 0.0 + fVar25 * 0.0;
      fVar18 = fVar18 + fVar18;
      fVar21 = fVar21 + fVar21;
      fVar45 = fVar18 * 1.0 + fVar21 * 0.0 + fVar39 * 0.0;
      fVar35 = fVar18 * 0.0 + fVar21 * 1.0 + fVar39 * 0.0;
      fVar19 = fVar18 * 0.0 + fVar21 * 0.0 + fVar39 * 1.0;
      fVar18 = fVar18 * 0.0 + fVar21 * 0.0 + fVar39 * 0.0;
      in_XMM14_Da = fVar47 * fVar17 + fVar36 * 0.0 + fVar45 * 0.0;
      in_XMM14_Db = fVar47 * fVar20 + fVar40 * 0.0 + fVar35 * 0.0;
      in_XMM14_Dc = fVar47 * fVar28 + fVar41 * 0.0 + fVar19 * 0.0;
      in_XMM14_Dd = fVar47 * fVar42 + fVar25 * 0.0 + fVar18 * 0.0;
      in_XMM11_Da = fVar29 * fVar17 + fVar24 * fVar36 + fVar45 * 0.0;
      in_XMM11_Db = fVar29 * fVar20 + fVar24 * fVar40 + fVar35 * 0.0;
      in_XMM11_Dc = fVar29 * fVar28 + fVar24 * fVar41 + fVar19 * 0.0;
      in_XMM11_Dd = fVar29 * fVar42 + fVar24 * fVar25 + fVar18 * 0.0;
      fVar39 = fVar38 * fVar17 + fVar43 * fVar36 + fVar44 * fVar45;
      in_XMM0_Db = fVar38 * fVar20 + fVar43 * fVar40 + fVar44 * fVar35;
      in_XMM0_Dc = fVar38 * fVar28 + fVar43 * fVar41 + fVar44 * fVar19;
      in_XMM0_Dd = fVar38 * fVar42 + fVar43 * fVar25 + fVar44 * fVar18;
      local_558._0_4_ =
           fVar46 * fVar17 + fVar34 * fVar36 + fVar27 * fVar45 +
           in_XMM10_Db * auVar30._0_4_ + fVar33 + 0.0;
      local_558._4_4_ =
           fVar46 * fVar20 + fVar34 * fVar40 + fVar27 * fVar35 +
           in_XMM10_Dc * auVar30._0_4_ + fVar15 * fVar37 + 0.0;
      fStack_550 = fVar46 * fVar28 + fVar34 * fVar41 + fVar27 * fVar19 +
                   fStack_4b0 * auVar30._0_4_ + in_XMM1_Dc * fVar37 + 0.0;
      fStack_54c = fVar46 * fVar42 + fVar34 * fVar25 + fVar27 * fVar18 + 0.0;
LAB_00a37728:
      goto LAB_00a37ae8;
    }
    fVar15 = extraout_XMM0_Db_00;
    fVar24 = extraout_XMM0_Dc_00;
    fVar25 = extraout_XMM0_Dd_00;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        in_XMM14_Db = *(float *)(pcVar6 + lVar12 + 0x10);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12);
        in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 4);
        fVar39 = *(float *)(pcVar6 + lVar12 + 8);
        fVar17 = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM14_Dc = *(float *)(pcVar6 + lVar12 + 0x20);
        in_XMM14_Dd = 0.0;
        in_XMM11_Db = *(float *)(pcVar6 + lVar12 + 0x14);
        in_XMM11_Dc = *(float *)(pcVar6 + lVar12 + 0x24);
        in_XMM11_Dd = 0.0;
        fVar15 = *(float *)(pcVar6 + lVar12 + 0x18);
        fVar24 = *(float *)(pcVar6 + lVar12 + 0x28);
        fVar25 = 0.0;
        fVar20 = *(float *)(pcVar6 + lVar12 + 0x1c);
        fVar29 = *(float *)(pcVar6 + lVar12 + 0x2c);
        fVar33 = 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = pRVar5->stride * i;
        in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        in_XMM14_Da = *(float *)(pcVar6 + lVar12);
        in_XMM14_Dd = 0.0;
        in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM11_Dd = 0.0;
        fVar39 = *(float *)(pcVar6 + lVar12 + 0x18);
        fVar15 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        fVar24 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        fVar25 = 0.0;
        fVar17 = *(float *)(pcVar6 + lVar12 + 0x24);
        fVar20 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
        fVar29 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
        fVar33 = 0.0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      fVar39 = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
      fVar15 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
      in_XMM14_Da = *(float *)(pcVar6 + lVar12);
      in_XMM11_Db = *(float *)(pcVar6 + lVar12 + 4);
      fVar24 = *(float *)(pcVar6 + lVar12 + 8);
      in_XMM6_Db = 0.0;
      in_XMM6_Dc = 0.0;
      in_XMM6_Dd = 0.0;
      in_XMM11_Da = *(float *)(pcVar6 + lVar12 + 0xc);
      fVar17 = *(float *)(pcVar6 + lVar12 + 0x18);
      fVar20 = *(float *)(pcVar6 + lVar12 + 0x1c);
      fVar29 = *(float *)((long)(pcVar6 + lVar12 + 0x1c) + 4);
      in_XMM4_Dc = 0.0;
      in_XMM4_Dd = 0.0;
      fVar33 = *(float *)(pcVar6 + lVar12 + 0x24);
      fVar34 = *(float *)(pcVar6 + lVar12 + 0x28);
      fVar27 = *(float *)(pcVar6 + lVar12 + 0x2c);
      fVar28 = *(float *)(pcVar6 + lVar12 + 0x30);
      fVar46 = fVar28 * fVar28 + fVar27 * fVar27 + fVar33 * fVar33 + fVar34 * fVar34;
      auVar30 = rsqrtss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
      fVar25 = auVar30._0_4_;
      fVar25 = fVar25 * fVar25 * fVar46 * -0.5 * fVar25 + fVar25 * 1.5;
      fVar33 = fVar33 * fVar25;
      in_XMM14_Dd = fVar34 * fVar25;
      in_XMM11_Dd = fVar27 * fVar25;
      in_XMM7 = ZEXT416((uint)in_XMM11_Dd);
      fVar25 = fVar25 * fVar28;
      in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
      in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
      in_XMM11_Dc = *(float *)(pcVar6 + lVar12 + 0x3c);
      in_XMM5_Db = 0.0;
      in_XMM5_Dd = 0.0;
      in_XMM5_Da = fVar33;
      in_XMM5_Dc = fVar29;
      in_XMM4_Da = fVar20;
      in_XMM4_Db = fVar29;
      in_XMM6_Da = fVar24;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = pRVar5->stride * i;
      pfVar1 = (float *)(pcVar6 + lVar12);
      in_XMM14_Da = *pfVar1;
      in_XMM14_Db = pfVar1[1];
      in_XMM14_Dc = pfVar1[2];
      in_XMM14_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
      in_XMM11_Da = *pfVar1;
      in_XMM11_Db = pfVar1[1];
      in_XMM11_Dc = pfVar1[2];
      in_XMM11_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x20);
      fVar39 = *pfVar1;
      fVar15 = pfVar1[1];
      fVar24 = pfVar1[2];
      fVar25 = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x30);
      fVar17 = *pfVar1;
      fVar20 = pfVar1[1];
      fVar29 = pfVar1[2];
      fVar33 = pfVar1[3];
    }
    pRVar5 = pRVar7 + (uVar9 + 1);
    RVar4 = pRVar7[uVar9 + 1].format;
    if ((int)RVar4 < 0x9244) {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        in_XMM5_Db = *(float *)(pcVar6 + lVar12 + 0x10);
        in_XMM5_Da = *(float *)(pcVar6 + lVar12);
        in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 4);
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 8);
        in_XMM5_Dc = *(float *)(pcVar6 + lVar12 + 0x20);
        in_XMM5_Dd = 0.0;
        in_XMM6_Db = *(float *)(pcVar6 + lVar12 + 0x14);
        in_XMM6_Dc = *(float *)(pcVar6 + lVar12 + 0x24);
        in_XMM6_Dd = 0.0;
        in_XMM4_Db = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 0x28);
        in_XMM4_Dd = 0.0;
        in_XMM7._4_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x1c);
        in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar12 + 0xc);
        in_XMM7._8_4_ = *(undefined4 *)(pcVar6 + lVar12 + 0x2c);
        in_XMM7._12_4_ = 0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar12 = i * pRVar5->stride;
        in_XMM5_Da = *(float *)(pcVar6 + lVar12);
        in_XMM5_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 4);
        in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 4) >> 0x20);
        in_XMM5_Dd = 0.0;
        in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 0xc);
        in_XMM6_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x10);
        in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x10) >> 0x20);
        in_XMM6_Dd = 0.0;
        in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0x18);
        in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
        in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
        in_XMM4_Dd = 0.0;
        in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x28);
        in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x24);
        in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x28) >> 0x20);
        in_XMM7._12_4_ = 0;
      }
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = i * pRVar5->stride;
      in_XMM4_Da = *(float *)(pcVar6 + lVar12 + 0x10);
      in_XMM4_Db = *(float *)((long)(pcVar6 + lVar12 + 0x10) + 4);
      in_XMM5_Da = *(float *)(pcVar6 + lVar12);
      in_XMM6_Db = *(float *)(pcVar6 + lVar12 + 4);
      in_XMM4_Dc = *(float *)(pcVar6 + lVar12 + 8);
      in_XMM6_Da = *(float *)(pcVar6 + lVar12 + 0xc);
      in_XMM5_Db = (float)*(undefined8 *)(pcVar6 + lVar12 + 0x34);
      in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x34) >> 0x20);
      fVar34 = *(float *)(pcVar6 + lVar12 + 0x24);
      fVar27 = *(float *)(pcVar6 + lVar12 + 0x28);
      fVar28 = *(float *)(pcVar6 + lVar12 + 0x2c);
      fVar46 = *(float *)(pcVar6 + lVar12 + 0x30);
      fVar38 = fVar46 * fVar46 + fVar28 * fVar28 + fVar34 * fVar34 + fVar27 * fVar27;
      auVar30 = rsqrtss(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
      auVar30._0_4_ =
           auVar30._0_4_ * auVar30._0_4_ * fVar38 * -0.5 * auVar30._0_4_ + auVar30._0_4_ * 1.5;
      in_XMM5_Dd = fVar27 * auVar30._0_4_;
      in_XMM6_Dd = fVar28 * auVar30._0_4_;
      in_XMM4_Dd = auVar30._0_4_ * fVar46;
      in_XMM6_Dc = *(float *)(pcVar6 + lVar12 + 0x3c);
      in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar12 + 0x1c);
      in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar12 + 0x18);
      in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar12 + 0x1c) >> 0x20);
      in_XMM7._12_4_ = fVar34 * auVar30._0_4_;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar12 = i * pRVar5->stride;
      pfVar1 = (float *)(pcVar6 + lVar12);
      in_XMM5_Da = *pfVar1;
      in_XMM5_Db = pfVar1[1];
      in_XMM5_Dc = pfVar1[2];
      in_XMM5_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x10);
      in_XMM6_Da = *pfVar1;
      in_XMM6_Db = pfVar1[1];
      in_XMM6_Dc = pfVar1[2];
      in_XMM6_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar6 + lVar12 + 0x20);
      in_XMM4_Da = *pfVar1;
      in_XMM4_Db = pfVar1[1];
      in_XMM4_Dc = pfVar1[2];
      in_XMM4_Dd = pfVar1[3];
      in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar12 + 0x30);
    }
    fVar34 = 1.0 - fVar37;
    in_XMM14_Da = in_XMM14_Da * fVar34 + in_XMM5_Da * fVar37;
    in_XMM14_Db = in_XMM14_Db * fVar34 + in_XMM5_Db * fVar37;
    in_XMM14_Dc = in_XMM14_Dc * fVar34 + in_XMM5_Dc * fVar37;
    in_XMM14_Dd = in_XMM14_Dd * fVar34 + in_XMM5_Dd * fVar37;
    in_XMM11_Da = in_XMM11_Da * fVar34 + in_XMM6_Da * fVar37;
    in_XMM11_Db = in_XMM11_Db * fVar34 + in_XMM6_Db * fVar37;
    in_XMM11_Dc = in_XMM11_Dc * fVar34 + in_XMM6_Dc * fVar37;
    in_XMM11_Dd = in_XMM11_Dd * fVar34 + in_XMM6_Dd * fVar37;
    fVar39 = fVar39 * fVar34 + in_XMM4_Da * fVar37;
    in_XMM0_Db = fVar15 * fVar34 + in_XMM4_Db * fVar37;
    in_XMM0_Dc = fVar24 * fVar34 + in_XMM4_Dc * fVar37;
    in_XMM0_Dd = fVar25 * fVar34 + in_XMM4_Dd * fVar37;
    local_558._0_4_ = fVar34 * fVar17 + fVar37 * in_XMM7._0_4_;
    local_558._4_4_ = fVar34 * fVar20 + fVar37 * in_XMM7._4_4_;
    fStack_550 = fVar34 * fVar29 + fVar37 * in_XMM7._8_4_;
    fStack_54c = fVar34 * fVar33 + fVar37 * in_XMM7._12_4_;
  }
LAB_00a37ae8:
  *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0;
  auVar23 = *(undefined1 (*) [16])(bbox1->lower).field_0.m128;
  uVar3 = *(undefined8 *)&(bbox1->upper).field_0;
  uVar8 = *(undefined8 *)((long)&(bbox1->upper).field_0 + 8);
  fVar15 = (bbox0->lower).field_0.m128[0];
  fVar17 = (bbox0->lower).field_0.m128[1];
  fVar20 = (bbox0->lower).field_0.m128[2];
  fVar29 = (bbox0->upper).field_0.m128[0];
  fVar33 = (bbox0->upper).field_0.m128[1];
  fVar24 = (bbox0->upper).field_0.m128[2];
  iVar10 = 0;
  do {
    fVar25 = (&obbox0->lower)[iVar10 != 0].field_0.m128[0];
    fVar34 = (&obbox1->lower)[iVar10 != 0].field_0.m128[0];
    iVar11 = 0;
    do {
      fVar27 = (&obbox0->lower)[iVar11 != 0].field_0.m128[1];
      fVar28 = (&obbox1->lower)[iVar11 != 0].field_0.m128[1];
      iVar13 = 0;
      do {
        fVar37 = (&obbox0->lower)[iVar13 != 0].field_0.m128[2];
        fVar46 = (&obbox1->lower)[iVar13 != 0].field_0.m128[2];
        auVar30._0_4_ = fVar25 - fVar34;
        fVar42 = fVar27 - fVar28;
        fVar44 = fVar37 - fVar46;
        fVar38 = fVar44 * ((float)local_548._0_4_ - fVar39) +
                 fVar42 * ((float)local_508._0_4_ - in_XMM11_Da) +
                 auVar30._0_4_ * ((float)local_4e8._0_4_ - in_XMM14_Da);
        fVar43 = fVar44 * ((float)local_548._4_4_ - in_XMM0_Db) +
                 fVar42 * ((float)local_508._4_4_ - in_XMM11_Db) +
                 auVar30._0_4_ * ((float)local_4e8._4_4_ - in_XMM14_Db);
        fVar45 = fVar44 * (fStack_540 - in_XMM0_Dc) + fVar42 * (fStack_500 - in_XMM11_Dc) +
                 auVar30._0_4_ * (fStack_4e0 - in_XMM14_Dc);
        auVar30._0_4_ =
             fVar44 * (fStack_53c - in_XMM0_Dd) + fVar42 * (fStack_4fc - in_XMM11_Dd) +
             auVar30._0_4_ * (fStack_4dc - in_XMM14_Dd);
        denom.field_0.m128[1] = fVar43 + fVar43;
        denom.field_0.m128[0] = fVar38 + fVar38;
        denom.field_0.m128[2] = fVar45 + fVar45;
        denom.field_0.m128[3] = auVar30._0_4_ + auVar30._0_4_;
        auVar30._0_4_ =
             (float)local_548._0_4_ * fVar37 + (float)local_518._0_4_ +
             (float)local_508._0_4_ * fVar27 + (float)local_4e8._0_4_ * fVar25;
        fVar38 = (float)local_548._4_4_ * fVar37 + (float)local_518._4_4_ +
                 (float)local_508._4_4_ * fVar27 + (float)local_4e8._4_4_ * fVar25;
        fVar42 = fStack_540 * fVar37 + fStack_510 + fStack_500 * fVar27 + fStack_4e0 * fVar25;
        fVar43 = fStack_53c * fVar37 + fStack_50c + fStack_4fc * fVar27 + fStack_4dc * fVar25;
        nom.field_0.m128[1] =
             ((fVar38 + fVar38) -
             (fVar46 * (float)local_548._4_4_ + (float)local_518._4_4_ +
              fVar28 * (float)local_508._4_4_ + fVar34 * (float)local_4e8._4_4_)) -
             (fVar37 * in_XMM0_Db + local_558._4_4_ + fVar27 * in_XMM11_Db + fVar25 * in_XMM14_Db);
        nom.field_0.m128[0] =
             ((auVar30._0_4_ + auVar30._0_4_) -
             (fVar46 * (float)local_548._0_4_ + (float)local_518._0_4_ +
              fVar28 * (float)local_508._0_4_ + fVar34 * (float)local_4e8._0_4_)) -
             (fVar37 * fVar39 + (float)local_558 + fVar27 * in_XMM11_Da + fVar25 * in_XMM14_Da);
        nom.field_0.m128[2] =
             ((fVar42 + fVar42) -
             (fVar46 * fStack_540 + fStack_510 + fVar28 * fStack_500 + fVar34 * fStack_4e0)) -
             (fVar37 * in_XMM0_Dc + fStack_550 + fVar27 * in_XMM11_Dc + fVar25 * in_XMM14_Dc);
        nom.field_0.m128[3] =
             ((fVar43 + fVar43) -
             (fVar46 * fStack_53c + fStack_50c + fVar28 * fStack_4fc + fVar34 * fStack_4dc)) -
             (fVar37 * in_XMM0_Dd + fStack_54c + fVar27 * in_XMM11_Dd + fVar25 * in_XMM14_Dd);
        lVar12 = 0;
        do {
          auVar30._0_4_ = *(float *)((long)&denom.field_0 + lVar12);
          if (auVar30._0_4_ != 0.0) {
            fVar38 = *(float *)(local_478 + lVar12 + -0x10);
            fVar42 = ((*(float *)((long)&(bbox1->lower).field_0 + lVar12) -
                      *(float *)((long)&(bbox0->lower).field_0 + lVar12)) + fVar38) / auVar30._0_4_;
            local_528 = auVar23._0_4_;
            fStack_524 = auVar23._4_4_;
            fStack_520 = auVar23._8_4_;
            local_4f8 = (float)uVar3;
            fStack_4f4 = (float)((ulong)uVar3 >> 0x20);
            fStack_4f0 = (float)uVar8;
            if ((tmin <= fVar42) && (fVar42 <= tmax)) {
              fVar43 = 1.0 - fVar42;
              bt.lower.field_0.m128[0] = fVar15 * fVar43 + local_528 * fVar42;
              bt.lower.field_0.m128[1] = fVar17 * fVar43 + fStack_524 * fVar42;
              bt.lower.field_0.m128[2] = fVar20 * fVar43 + fStack_520 * fVar42;
              bt.upper.field_0.m128[0] = fVar29 * fVar43 + local_4f8 * fVar42;
              bt.upper.field_0.m128[1] = fVar33 * fVar43 + fStack_4f4 * fVar42;
              bt.upper.field_0.m128[2] = fVar24 * fVar43 + fStack_4f0 * fVar42;
              fVar44 = fVar43 * fVar25 + fVar42 * fVar34;
              fVar45 = fVar43 * fVar27 + fVar42 * fVar28;
              fVar36 = fVar43 * fVar37 + fVar42 * fVar46;
              pt.field_0.m128[1] =
                   fVar36 * ((float)local_548._4_4_ * fVar43 + in_XMM0_Db * fVar42) +
                   (float)local_518._4_4_ * fVar43 + local_558._4_4_ * fVar42 +
                   fVar45 * ((float)local_508._4_4_ * fVar43 + in_XMM11_Db * fVar42) +
                   fVar44 * ((float)local_4e8._4_4_ * fVar43 + in_XMM14_Db * fVar42);
              pt.field_0.m128[0] =
                   fVar36 * ((float)local_548._0_4_ * fVar43 + fVar39 * fVar42) +
                   (float)local_518._0_4_ * fVar43 + (float)local_558 * fVar42 +
                   fVar45 * ((float)local_508._0_4_ * fVar43 + in_XMM11_Da * fVar42) +
                   fVar44 * ((float)local_4e8._0_4_ * fVar43 + in_XMM14_Da * fVar42);
              pt.field_0.m128[3] =
                   fVar36 * (fStack_53c * fVar43 + in_XMM0_Dd * fVar42) +
                   fStack_50c * fVar43 + fStack_54c * fVar42 +
                   fVar45 * (fStack_4fc * fVar43 + in_XMM11_Dd * fVar42) +
                   fVar44 * (fStack_4dc * fVar43 + in_XMM14_Dd * fVar42);
              pt.field_0.m128[2] =
                   fVar36 * (fStack_540 * fVar43 + in_XMM0_Dc * fVar42) +
                   fStack_510 * fVar43 + fStack_550 * fVar42 +
                   fVar45 * (fStack_500 * fVar43 + in_XMM11_Dc * fVar42) +
                   fVar44 * (fStack_4e0 * fVar43 + in_XMM14_Dc * fVar42);
              fVar43 = *(float *)((long)&pt.field_0 + lVar12) -
                       *(float *)((long)&bt.lower.field_0 + lVar12);
              fVar42 = *(float *)((long)&(__return_storage_ptr__->lower).field_0 + lVar12);
              if (fVar42 <= fVar43) {
                fVar43 = fVar42;
              }
              *(float *)((long)&(__return_storage_ptr__->lower).field_0 + lVar12) = fVar43;
            }
            auVar30._0_4_ =
                 (fVar38 + (*(float *)((long)&(bbox1->upper).field_0 + lVar12) -
                           *(float *)((long)&(bbox0->upper).field_0 + lVar12))) / auVar30._0_4_;
            if ((tmin <= auVar30._0_4_) && (auVar30._0_4_ <= tmax)) {
              fVar38 = 1.0 - auVar30._0_4_;
              bt.lower.field_0.m128[0] = fVar15 * fVar38 + local_528 * auVar30._0_4_;
              bt.lower.field_0.m128[1] = fVar17 * fVar38 + fStack_524 * auVar30._0_4_;
              bt.lower.field_0.m128[2] = fVar20 * fVar38 + fStack_520 * auVar30._0_4_;
              bt.upper.field_0.m128[0] = fVar29 * fVar38 + local_4f8 * auVar30._0_4_;
              bt.upper.field_0.m128[1] = fVar33 * fVar38 + fStack_4f4 * auVar30._0_4_;
              bt.upper.field_0.m128[2] = fVar24 * fVar38 + fStack_4f0 * auVar30._0_4_;
              fVar42 = fVar38 * fVar25 + auVar30._0_4_ * fVar34;
              fVar43 = fVar38 * fVar27 + auVar30._0_4_ * fVar28;
              fVar44 = fVar38 * fVar37 + auVar30._0_4_ * fVar46;
              pt.field_0.m128[1] =
                   fVar44 * ((float)local_548._4_4_ * fVar38 + in_XMM0_Db * auVar30._0_4_) +
                   (float)local_518._4_4_ * fVar38 + local_558._4_4_ * auVar30._0_4_ +
                   fVar43 * ((float)local_508._4_4_ * fVar38 + in_XMM11_Db * auVar30._0_4_) +
                   fVar42 * ((float)local_4e8._4_4_ * fVar38 + in_XMM14_Db * auVar30._0_4_);
              pt.field_0.m128[0] =
                   fVar44 * ((float)local_548._0_4_ * fVar38 + fVar39 * auVar30._0_4_) +
                   (float)local_518._0_4_ * fVar38 + (float)local_558 * auVar30._0_4_ +
                   fVar43 * ((float)local_508._0_4_ * fVar38 + in_XMM11_Da * auVar30._0_4_) +
                   fVar42 * ((float)local_4e8._0_4_ * fVar38 + in_XMM14_Da * auVar30._0_4_);
              pt.field_0.m128[3] =
                   fVar44 * (fStack_53c * fVar38 + in_XMM0_Dd * auVar30._0_4_) +
                   fStack_50c * fVar38 + fStack_54c * auVar30._0_4_ +
                   fVar43 * (fStack_4fc * fVar38 + in_XMM11_Dd * auVar30._0_4_) +
                   fVar42 * (fStack_4dc * fVar38 + in_XMM14_Dd * auVar30._0_4_);
              pt.field_0.m128[2] =
                   fVar44 * (fStack_540 * fVar38 + in_XMM0_Dc * auVar30._0_4_) +
                   fStack_510 * fVar38 + fStack_550 * auVar30._0_4_ +
                   fVar43 * (fStack_500 * fVar38 + in_XMM11_Dc * auVar30._0_4_) +
                   fVar42 * (fStack_4e0 * fVar38 + in_XMM14_Dc * auVar30._0_4_);
              fVar38 = *(float *)((long)&pt.field_0 + lVar12) -
                       *(float *)((long)&bt.upper.field_0 + lVar12);
              auVar30._0_4_ = *(float *)((long)&(__return_storage_ptr__->upper).field_0 + lVar12);
              if (fVar38 <= auVar30._0_4_) {
                fVar38 = auVar30._0_4_;
              }
              *(float *)((long)&(__return_storage_ptr__->upper).field_0 + lVar12) = fVar38;
            }
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0xc);
        bVar14 = iVar13 == 0;
        iVar13 = iVar13 + 1;
      } while (bVar14);
      bVar14 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar14);
    bVar14 = iVar10 == 0;
    iVar10 = iVar10 + 1;
  } while (bVar14);
  return __return_storage_ptr__;
}

Assistant:

BBox3fa InstanceArray::boundSegment(size_t i, size_t itime,
      BBox3fa const& obbox0, BBox3fa const& obbox1,
      BBox3fa const& bbox0, BBox3fa const& bbox1,
      float tmin, float tmax) const
  {
    if (unlikely(gsubtype == GTY_SUBTYPE_INSTANCE_QUATERNION)) {
      auto const& xfm0 = l2w(i, itime);
      auto const& xfm1 = l2w(i, itime+1);
      MotionDerivativeCoefficients motionDerivCoeffs(xfm0, xfm1);
      return boundSegmentNonlinear(motionDerivCoeffs, xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    } else {
      auto const& xfm0 = getLocal2World(i, itime);
      auto const& xfm1 = getLocal2World(i, itime+1);
      return boundSegmentLinear(xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    }
  }